

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsmanal.cpp
# Opt level: O2

void __thiscall
TPZSubMeshAnalysis::SetCompMesh
          (TPZSubMeshAnalysis *this,TPZCompMesh *mesh,bool mustOptimizeBandwidth)

{
  TPZCompMesh *this_00;
  TPZSubCompMesh *pTVar1;
  int64_t newRows;
  
  if (mesh != (TPZCompMesh *)0x0) {
    pTVar1 = (TPZSubCompMesh *)
             __dynamic_cast(mesh,&TPZCompMesh::typeinfo,&TPZSubCompMesh::typeinfo,0);
    if (pTVar1 != (TPZSubCompMesh *)0x0) {
      this->fMesh = pTVar1;
      TPZAnalysis::SetCompMesh((TPZAnalysis *)this,mesh,mustOptimizeBandwidth);
      this_00 = (this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh;
      if (this_00 != (TPZCompMesh *)0x0) {
        newRows = TPZCompMesh::NEquations(this_00);
        TPZFMatrix<double>::Redim(&this->fReferenceSolution,newRows,1);
        return;
      }
      return;
    }
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Analysis/pzsmanal.cpp"
             ,0x2d);
}

Assistant:

void TPZSubMeshAnalysis::SetCompMesh(TPZCompMesh * mesh, bool mustOptimizeBandwidth)
{
    TPZSubCompMesh *submesh = dynamic_cast<TPZSubCompMesh *>(mesh);
    if (submesh) {
        fMesh = submesh;
    }
    else
    {
        DebugStop();
    }
    TPZLinearAnalysis::SetCompMesh(mesh, mustOptimizeBandwidth);
    if (fCompMesh) {
        fReferenceSolution.Redim(fCompMesh->NEquations(), 1);
    }
}